

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::blit_framebuffer_multisample
               (NegativeTestContext *ctx)

{
  bool bVar1;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLuint local_20;
  GLuint local_1c;
  deUint32 rbo [2];
  deUint32 fbo [2];
  NegativeTestContext *ctx_local;
  
  glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,2,rbo);
  glu::CallLogWrapper::glGenRenderbuffers(&ctx->super_CallLogWrapper,2,&local_20);
  glu::CallLogWrapper::glBindRenderbuffer(&ctx->super_CallLogWrapper,0x8d41,local_20);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8ca8,rbo[0]);
  glu::CallLogWrapper::glRenderbufferStorageMultisample
            (&ctx->super_CallLogWrapper,0x8d41,4,0x8058,0x20,0x20);
  glu::CallLogWrapper::glFramebufferRenderbuffer
            (&ctx->super_CallLogWrapper,0x8ca8,0x8ce0,0x8d41,local_20);
  glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8ca8);
  glu::CallLogWrapper::glBindRenderbuffer(&ctx->super_CallLogWrapper,0x8d41,local_1c);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8ca9,rbo[1]);
  NegativeTestContext::expectError(ctx,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GL_NV_framebuffer_multisample",&local_41);
  bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "GL_INVALID_OPERATION is generated if the value of GL_SAMPLE_BUFFERS for the draw buffer is greater than zero."
               ,&local_79);
    NegativeTestContext::beginSection(ctx,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    glu::CallLogWrapper::glRenderbufferStorageMultisample
              (&ctx->super_CallLogWrapper,0x8d41,4,0x8058,0x20,0x20);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&ctx->super_CallLogWrapper,0x8ca9,0x8ce0,0x8d41,local_1c);
    glu::CallLogWrapper::glBlitFramebuffer
              (&ctx->super_CallLogWrapper,0,0,0x10,0x10,0,0,0x10,0x10,0x4000,0x2600);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,
               "GL_INVALID_OPERATION is generated if GL_SAMPLE_BUFFERS for the read buffer is greater than zero and the formats of draw and read buffers are not identical."
               ,&local_a1);
    NegativeTestContext::beginSection(ctx,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    glu::CallLogWrapper::glRenderbufferStorage(&ctx->super_CallLogWrapper,0x8d41,0x8056,0x20,0x20);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&ctx->super_CallLogWrapper,0x8ca9,0x8ce0,0x8d41,local_1c);
    glu::CallLogWrapper::glBlitFramebuffer
              (&ctx->super_CallLogWrapper,0,0,0x10,0x10,0,0,0x10,0x10,0x4000,0x2600);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,
               "GL_INVALID_OPERATION is generated if GL_SAMPLE_BUFFERS for the read buffer is greater than zero and the source and destination rectangles are not defined with the same (X0, Y0) and (X1, Y1) bounds."
               ,&local_c9);
    NegativeTestContext::beginSection(ctx,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    glu::CallLogWrapper::glRenderbufferStorage(&ctx->super_CallLogWrapper,0x8d41,0x8058,0x20,0x20);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&ctx->super_CallLogWrapper,0x8ca9,0x8ce0,0x8d41,local_1c);
    glu::CallLogWrapper::glBlitFramebuffer
              (&ctx->super_CallLogWrapper,0,0,0x10,0x10,2,2,0x12,0x12,0x4000,0x2600);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
  }
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteRenderbuffers(&ctx->super_CallLogWrapper,2,&local_20);
  glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,2,rbo);
  return;
}

Assistant:

void blit_framebuffer_multisample (NegativeTestContext& ctx)
{
	deUint32							fbo[2];
	deUint32							rbo[2];

	ctx.glGenFramebuffers				(2, fbo);
	ctx.glGenRenderbuffers				(2, rbo);

	ctx.glBindRenderbuffer				(GL_RENDERBUFFER, rbo[0]);
	ctx.glBindFramebuffer				(GL_READ_FRAMEBUFFER, fbo[0]);
	ctx.glRenderbufferStorageMultisample(GL_RENDERBUFFER, 4, GL_RGBA8, 32, 32);
	ctx.glFramebufferRenderbuffer		(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo[0]);
	ctx.glCheckFramebufferStatus		(GL_READ_FRAMEBUFFER);

	ctx.glBindRenderbuffer				(GL_RENDERBUFFER, rbo[1]);
	ctx.glBindFramebuffer				(GL_DRAW_FRAMEBUFFER, fbo[1]);

	ctx.expectError						(GL_NO_ERROR);

	if (!ctx.isExtensionSupported("GL_NV_framebuffer_multisample"))
	{
		ctx.beginSection("GL_INVALID_OPERATION is generated if the value of GL_SAMPLE_BUFFERS for the draw buffer is greater than zero.");
		ctx.glRenderbufferStorageMultisample(GL_RENDERBUFFER, 4, GL_RGBA8, 32, 32);
		ctx.glFramebufferRenderbuffer		(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo[1]);
		ctx.glBlitFramebuffer				(0, 0, 16, 16, 0, 0, 16, 16, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		ctx.expectError						(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated if GL_SAMPLE_BUFFERS for the read buffer is greater than zero and the formats of draw and read buffers are not identical.");
		ctx.glRenderbufferStorage			(GL_RENDERBUFFER, GL_RGBA4, 32, 32);
		ctx.glFramebufferRenderbuffer		(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo[1]);
		ctx.glBlitFramebuffer				(0, 0, 16, 16, 0, 0, 16, 16, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		ctx.expectError						(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated if GL_SAMPLE_BUFFERS for the read buffer is greater than zero and the source and destination rectangles are not defined with the same (X0, Y0) and (X1, Y1) bounds.");
		ctx.glRenderbufferStorage			(GL_RENDERBUFFER, GL_RGBA8, 32, 32);
		ctx.glFramebufferRenderbuffer		(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo[1]);
		ctx.glBlitFramebuffer				(0, 0, 16, 16, 2, 2, 18, 18, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		ctx.expectError						(GL_INVALID_OPERATION);
		ctx.endSection();
	}

	ctx.glBindFramebuffer				(GL_FRAMEBUFFER, 0);
	ctx.glDeleteRenderbuffers			(2, rbo);
	ctx.glDeleteFramebuffers			(2, fbo);
}